

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int handle_key_update(ptls_t *tls,ptls_message_emitter_t *emitter,ptls_iovec_t message)

{
  byte *pbVar1;
  long in_RCX;
  long in_RDX;
  long *in_RDI;
  int ret;
  uint8_t *end;
  uint8_t *src;
  int in_stack_0000006c;
  ptls_t *in_stack_00000070;
  int local_4;
  
  pbVar1 = (byte *)(in_RDX + 4);
  if (((in_RDX + in_RCX) - (long)pbVar1 == 1) && (*pbVar1 < 2)) {
    local_4 = update_traffic_key(in_stack_00000070,in_stack_0000006c);
    if (local_4 == 0) {
      if (*pbVar1 != 0) {
        if (*(long *)(*in_RDI + 0x98) != 0) {
          return 10;
        }
        *(byte *)(in_RDI + 0x2c) = *(byte *)(in_RDI + 0x2c) & 0xf7 | 8;
      }
      local_4 = 0;
    }
  }
  else {
    local_4 = 0x32;
  }
  return local_4;
}

Assistant:

static int handle_key_update(ptls_t *tls, ptls_message_emitter_t *emitter, ptls_iovec_t message)
{
    const uint8_t *src = message.base + PTLS_HANDSHAKE_HEADER_SIZE, *const end = message.base + message.len;
    int ret;

    /* validate */
    if (end - src != 1 || *src > 1)
        return PTLS_ALERT_DECODE_ERROR;

    /* update receive key */
    if ((ret = update_traffic_key(tls, 0)) != 0)
        return ret;

    if (*src) {
        if (tls->ctx->update_traffic_key != NULL)
            return PTLS_ALERT_UNEXPECTED_MESSAGE;
        tls->needs_key_update = 1;
    }

    return 0;
}